

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O0

void dumpToken(KonohaContext *kctx,kToken *tk,int n)

{
  _func_int_char_ptr_varargs *p_Var1;
  char *pcVar2;
  char *pcVar3;
  kString *pkVar4;
  uintptr_t uVar5;
  uint in_EDX;
  long in_RSI;
  KonohaContext *in_RDI;
  ksymbol_t in_stack_ffffffffffffff3c;
  KonohaContext *in_stack_ffffffffffffff40;
  KonohaContext *in_stack_ffffffffffffff48;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var6;
  uint local_14;
  
  if (verbose_sugar != 0) {
    local_14 = in_EDX;
    if ((int)in_EDX < 0) {
      local_14 = (uint)(short)*(undefined8 *)(in_RSI + 0x18);
    }
    p_Var1 = in_RDI->platApi->printf_i;
    pcVar2 = kToken_t(in_stack_ffffffffffffff48,(kToken *)in_stack_ffffffffffffff40);
    pcVar3 = KSymbol_prefixText((ksymbol_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    p_Var6 = ((pkVar4->h).ct)->unbox;
    pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar5 = (*p_Var6)(in_RDI,(kObject_conflict *)pkVar4);
    (*p_Var1)("Token[%d] \'%s\' TokenType=%s%s",(ulong)local_14,pcVar2,pcVar3,uVar5);
    if (*(int *)(in_RSI + 0x28) == -0x1fffffff) {
      (*in_RDI->platApi->printf_i)(" indent=+%d",(ulong)*(uint *)(in_RSI + 0x2c));
    }
    if (*(int *)(in_RSI + 0x30) != 0) {
      p_Var1 = in_RDI->platApi->printf_i;
      pcVar2 = KSymbol_prefixText((ksymbol_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      p_Var6 = ((pkVar4->h).ct)->unbox;
      pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      uVar5 = (*p_Var6)(in_RDI,(kObject_conflict *)pkVar4);
      (*p_Var1)(" Symbol=%s%s",pcVar2,uVar5);
    }
    if ((*(long *)(in_RSI + 0x38) == 0) ||
       (*(int *)(*(long *)(in_RSI + 0x38) + 0x20) != -0x1ffffffa)) {
      if (*(int *)(in_RSI + 0x34) != 0) {
        p_Var1 = in_RDI->platApi->printf_i;
        pcVar2 = KSymbol_prefixText((ksymbol_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        p_Var6 = ((pkVar4->h).ct)->unbox;
        pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        uVar5 = (*p_Var6)(in_RDI,(kObject_conflict *)pkVar4);
        (*p_Var1)(" ruleNameSymbol=%s%s",pcVar2,uVar5);
      }
    }
    else {
      p_Var1 = in_RDI->platApi->printf_i;
      pkVar4 = KType_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      p_Var6 = ((pkVar4->h).ct)->unbox;
      pkVar4 = KType_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      uVar5 = (*p_Var6)(in_RDI,(kObject_conflict *)pkVar4);
      (*p_Var1)(" resolvedType=%s",uVar5);
    }
    if (*(long *)(in_RSI + 0x38) == 0) {
      (*in_RDI->platApi->printf_i)(" Syntax=NULL\n");
    }
    else {
      p_Var1 = in_RDI->platApi->printf_i;
      pcVar2 = KSymbol_prefixText((ksymbol_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      pkVar4 = KSymbol_GetString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      p_Var6 = ((pkVar4->h).ct)->unbox;
      pkVar4 = KSymbol_GetString(in_RDI,in_stack_ffffffffffffff3c);
      uVar5 = (*p_Var6)(in_RDI,(kObject_conflict *)pkVar4);
      (*p_Var1)(" Syntax=%s%s\n",pcVar2,uVar5);
    }
  }
  return;
}

Assistant:

static void dumpToken(KonohaContext *kctx, kToken *tk, int n)
{
	if(verbose_sugar) {
		if(n < 0) n = (short) tk->uline;
		DUMP_P("Token[%d] '%s' TokenType=%s%s", n, KToken_t(tk), KSymbol_Fmt2(tk->tokenType));
		if(kToken_IsIndent(tk)) {
			DUMP_P(" indent=+%d", tk->indent);
		}
		if(tk->symbol > 0) {
			DUMP_P(" Symbol=%s%s", KSymbol_Fmt2(tk->symbol));
		}
		if(tk->resolvedSyntaxInfo != NULL && tk->resolvedSyntaxInfo->keyword == KSymbol_TypePattern) {
			DUMP_P(" resolvedType=%s", KType_text(tk->resolvedTypeId));
		}else {
			if(tk->ruleNameSymbol > 0) {
				DUMP_P(" ruleNameSymbol=%s%s", KSymbol_Fmt2(tk->ruleNameSymbol));
			}
		}
		if(tk->resolvedSyntaxInfo == NULL) {
			DUMP_P(" Syntax=NULL\n");
		}
		else {
			DUMP_P(" Syntax=%s%s\n", KSymbol_Fmt2(tk->resolvedSyntaxInfo->keyword));
		}
	}
}